

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::VertexIDReferenceShader::VertexIDReferenceShader
          (VertexIDReferenceShader *this)

{
  pointer pVVar1;
  
  rr::VertexShader::VertexShader(&this->super_VertexShader,2,1);
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,1,1);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_02181750;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_02181770;
  *(undefined8 *)
   (this->super_VertexShader).m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  pVVar1 = (this->super_VertexShader).m_outputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar1->type = GENERICVECTYPE_FLOAT;
  pVVar1->flatshade = false;
  pVVar1 = (this->super_FragmentShader).m_inputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar1->type = GENERICVECTYPE_FLOAT;
  pVVar1->flatshade = false;
  ((this->super_FragmentShader).m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  return;
}

Assistant:

VertexIDReferenceShader ()
		: rr::VertexShader	(2, 1)		// color and pos in => color out
		, rr::FragmentShader(1, 1)		// color in => color out
	{
		this->rr::VertexShader::m_inputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::VertexShader::m_inputs[1].type		= rr::GENERICVECTYPE_FLOAT;

		this->rr::VertexShader::m_outputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::VertexShader::m_outputs[0].flatshade	= false;

		this->rr::FragmentShader::m_inputs[0].type		= rr::GENERICVECTYPE_FLOAT;
		this->rr::FragmentShader::m_inputs[0].flatshade	= false;

		this->rr::FragmentShader::m_outputs[0].type		= rr::GENERICVECTYPE_FLOAT;
	}